

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O2

DiagnosticSeverity __thiscall
slang::DiagnosticEngine::getSeverity(DiagnosticEngine *this,DiagCode code,SourceLocation location)

{
  group_type_pointer pgVar1;
  char cVar2;
  undefined4 uVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  uint uVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  byte bVar16;
  undefined1 auVar17 [16];
  _Optional_payload_base<slang::DiagnosticSeverity> _Stack_40;
  
  _Stack_40 = (_Optional_payload_base<slang::DiagnosticSeverity>)
              findMappedSeverity(this,code,location);
  if (((ulong)_Stack_40 >> 0x20 & 1) != 0) goto switchD_005225a2_default;
  auVar17 = ZEXT416((int)code << 0x10 | (uint)code >> 0x10) * ZEXT816(0x9e3779b97f4a7c15);
  uVar10 = auVar17._8_8_ ^ auVar17._0_8_;
  uVar8 = uVar10 >> ((byte)(this->severityTable).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                           .arrays.groups_size_index & 0x3f);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar10 & 0xff];
  ppVar4 = (this->severityTable).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
           .arrays.elements_;
  uVar5 = (this->severityTable).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
          .arrays.groups_size_mask;
  uVar11 = 0;
  do {
    pgVar1 = (this->severityTable).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
             .arrays.groups_ + uVar8;
    bVar7 = pgVar1->m[0xf].n;
    uVar13 = (uchar)uVar3;
    auVar17[0] = -(pgVar1->m[0].n == uVar13);
    uVar14 = (uchar)((uint)uVar3 >> 8);
    auVar17[1] = -(pgVar1->m[1].n == uVar14);
    uVar15 = (uchar)((uint)uVar3 >> 0x10);
    auVar17[2] = -(pgVar1->m[2].n == uVar15);
    bVar16 = (byte)((uint)uVar3 >> 0x18);
    auVar17[3] = -(pgVar1->m[3].n == bVar16);
    auVar17[4] = -(pgVar1->m[4].n == uVar13);
    auVar17[5] = -(pgVar1->m[5].n == uVar14);
    auVar17[6] = -(pgVar1->m[6].n == uVar15);
    auVar17[7] = -(pgVar1->m[7].n == bVar16);
    auVar17[8] = -(pgVar1->m[8].n == uVar13);
    auVar17[9] = -(pgVar1->m[9].n == uVar14);
    auVar17[10] = -(pgVar1->m[10].n == uVar15);
    auVar17[0xb] = -(pgVar1->m[0xb].n == bVar16);
    auVar17[0xc] = -(pgVar1->m[0xc].n == uVar13);
    auVar17[0xd] = -(pgVar1->m[0xd].n == uVar14);
    auVar17[0xe] = -(pgVar1->m[0xe].n == uVar15);
    auVar17[0xf] = -(bVar7 == bVar16);
    for (uVar12 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe); uVar12 != 0;
        uVar12 = uVar12 - 1 & uVar12) {
      uVar6 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      if (ppVar4[uVar8 * 0xf + (ulong)uVar6].first == code) {
        _Stack_40._4_4_ = 0;
        _Stack_40._M_payload._M_value = ppVar4[uVar8 * 0xf + (ulong)uVar6].second;
        goto switchD_005225a2_default;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar10 & 7] & bVar7) == 0) break;
    lVar9 = uVar8 + uVar11;
    uVar11 = uVar11 + 1;
    uVar8 = lVar9 + 1U & uVar5;
  } while (uVar11 <= uVar5);
  _Stack_40._M_payload._M_value = getDefaultSeverity(code);
  _Stack_40._4_4_ = 0;
  switch(_Stack_40._M_payload._M_value) {
  case Note:
    if (this->ignoreAllNotes == false) break;
    goto LAB_005225d4;
  case Warning:
    if (this->ignoreAllWarnings == false) {
      cVar2 = this->warningsAsErrors;
      goto joined_r0x005225ca;
    }
LAB_005225d4:
    _Stack_40._M_payload = (_Storage<slang::DiagnosticSeverity,_true>)0x0;
    _Stack_40._M_engaged = false;
    _Stack_40._5_3_ = 0;
    break;
  case Error:
    if (this->errorsAsFatal != false) {
      _Stack_40._M_payload = (_Storage<slang::DiagnosticSeverity,_true>)0x4;
      _Stack_40._M_engaged = false;
      _Stack_40._5_3_ = 0;
    }
    break;
  case Fatal:
    cVar2 = this->fatalsAsErrors;
joined_r0x005225ca:
    if (cVar2 != '\0') {
      _Stack_40._M_payload = (_Storage<slang::DiagnosticSeverity,_true>)0x3;
      _Stack_40._M_engaged = false;
      _Stack_40._5_3_ = 0;
    }
  }
switchD_005225a2_default:
  return (DiagnosticSeverity)_Stack_40._M_payload;
}

Assistant:

DiagnosticSeverity DiagnosticEngine::getSeverity(DiagCode code, SourceLocation location) const {
    // Check if we have an in-source severity configured.
    if (auto sev = findMappedSeverity(code, location); sev.has_value())
        return *sev;

    if (auto it = severityTable.find(code); it != severityTable.end())
        return it->second;

    auto result = getDefaultSeverity(code);
    switch (result) {
        case DiagnosticSeverity::Ignored:
            break;
        case DiagnosticSeverity::Note:
            if (ignoreAllNotes)
                return DiagnosticSeverity::Ignored;
            break;
        case DiagnosticSeverity::Warning:
            if (ignoreAllWarnings)
                return DiagnosticSeverity::Ignored;
            if (warningsAsErrors)
                return DiagnosticSeverity::Error;
            break;
        case DiagnosticSeverity::Error:
            if (errorsAsFatal)
                return DiagnosticSeverity::Fatal;
            break;
        case DiagnosticSeverity::Fatal:
            if (fatalsAsErrors)
                return DiagnosticSeverity::Error;
            break;
    }
    return result;
}